

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsElfFile.cpp
# Opt level: O1

void __thiscall DirectiveLoadMipsElf::writeTempData(DirectiveLoadMipsElf *this,TempData *tempData)

{
  bool bVar1;
  int64_t memoryAddress;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  string local_88;
  string local_68;
  string local_48;
  
  bVar1 = ghc::filesystem::path::empty(&this->outputName);
  memoryAddress = FileManager::getVirtualAddress(g_fileManager);
  if (bVar1) {
    ghc::filesystem::path::u8string_abi_cxx11_(&local_68,&this->inputName);
    tinyformat::format<std::__cxx11::string>
              (&local_88,(tinyformat *)".loadelf \"%s\"",(char *)&local_68,in_RCX);
    TempData::writeLine(tempData,memoryAddress,&local_88);
    local_48.field_2._M_allocated_capacity = local_88.field_2._M_allocated_capacity;
    local_48._M_dataplus._M_p = local_88._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p == &local_88.field_2) goto LAB_00181cb1;
  }
  else {
    ghc::filesystem::path::u8string_abi_cxx11_(&local_68,&this->inputName);
    ghc::filesystem::path::u8string_abi_cxx11_(&local_48,&this->outputName);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (&local_88,(tinyformat *)".loadelf \"%s\",\"%s\"",(char *)&local_68,&local_48,in_R8);
    TempData::writeLine(tempData,memoryAddress,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p == &local_48.field_2) goto LAB_00181cb1;
  }
  operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
LAB_00181cb1:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void DirectiveLoadMipsElf::writeTempData(TempData& tempData) const
{
	if (outputName.empty())
	{
		tempData.writeLine(g_fileManager->getVirtualAddress(),tfm::format(".loadelf \"%s\"",inputName.u8string()));
	} else {
		tempData.writeLine(g_fileManager->getVirtualAddress(),tfm::format(".loadelf \"%s\",\"%s\"",
			inputName.u8string(),outputName.u8string()));
	}
}